

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int k2proto(FuncState *fs,TValue *key,TValue *v)

{
  Proto *f_00;
  byte bVar1;
  TValue *io;
  int k;
  int tag;
  Proto *f;
  TValue val;
  TValue *v_local;
  TValue *key_local;
  FuncState *fs_local;
  
  f_00 = fs->f;
  val._8_8_ = v;
  bVar1 = luaH_get(fs->kcache,key,(TValue *)&f);
  if ((bVar1 & 0xf) == 0) {
    fs_local._4_4_ = addk(fs,f_00,(TValue *)val._8_8_);
    val.value_.ub = '\x03';
    luaH_set(fs->ls->L,fs->kcache,key,(TValue *)&f);
  }
  else {
    fs_local._4_4_ = (int)f;
  }
  return fs_local._4_4_;
}

Assistant:

static int k2proto (FuncState *fs, TValue *key, TValue *v) {
  TValue val;
  Proto *f = fs->f;
  int tag = luaH_get(fs->kcache, key, &val);  /* query scanner table */
  int k;
  if (!tagisempty(tag)) {  /* is there an index there? */
    k = cast_int(ivalue(&val));
    /* collisions can happen only for float keys */
    lua_assert(ttisfloat(key) || luaV_rawequalobj(&f->k[k], v));
    return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  k = addk(fs, f, v);
  /* cache it for reuse; numerical value does not need GC barrier;
     table is not a metatable, so it does not need to invalidate cache */
  setivalue(&val, k);
  luaH_set(fs->ls->L, fs->kcache, key, &val);
  return k;
}